

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O3

Utest * __thiscall
TEST_MemoryLeakDetectorTest_memoryDumpOutput_TestShell::createTest
          (TEST_MemoryLeakDetectorTest_memoryDumpOutput_TestShell *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(0x20,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
                                  ,0xa3);
  this_00->_vptr_Utest = (_func_int **)0x0;
  this_00[1]._vptr_Utest = (_func_int **)0x0;
  this_00[2]._vptr_Utest = (_func_int **)0x0;
  this_00[3]._vptr_Utest = (_func_int **)0x0;
  Utest::Utest(this_00);
  this_00->_vptr_Utest = (_func_int **)&PTR__Utest_0035b6e8;
  return this_00;
}

Assistant:

TEST(MemoryLeakDetectorTest, memoryDumpOutput)
{
    char* mem = detector->allocMemory(defaultNewAllocator(), 6);
    SimpleString::StrNCpy(mem, "test1", 6);
    SimpleString output = detector->report(mem_leak_period_checking);

    STRCMP_CONTAINS("Alloc num (1)", output.asCharString());
    STRCMP_CONTAINS("Leak size: 6 Allocated at",  output.asCharString());
    STRCMP_CONTAINS("Content:",  output.asCharString());
    STRCMP_CONTAINS("0000: 74 65 73 74 31 00                                |test1.|", output.asCharString());

    PlatformSpecificFree(mem);
}